

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_Ticker(void)

{
  bool bVar1;
  double dVar2;
  
  if (automapactive) {
    amclock = amclock + 1;
    bVar1 = FBoolCVar::operator_cast_to_bool(&am_followplayer);
    if (bVar1) {
      AM_doFollowPlayer();
    }
    else {
      m_paninc.y = 0.0;
      m_paninc.x = 0.0;
      if (Button_AM_PanLeft.bDown != '\0') {
        dVar2 = FTOM(4.0);
        m_paninc.x = m_paninc.x - dVar2;
      }
      if (Button_AM_PanRight.bDown != '\0') {
        dVar2 = FTOM(4.0);
        m_paninc.x = dVar2 + m_paninc.x;
      }
      if (Button_AM_PanUp.bDown != '\0') {
        dVar2 = FTOM(4.0);
        m_paninc.y = dVar2 + m_paninc.y;
      }
      if (Button_AM_PanDown.bDown != '\0') {
        dVar2 = FTOM(4.0);
        m_paninc.y = m_paninc.y - dVar2;
      }
    }
    if ((((Button_AM_ZoomIn.bDown != '\0') || (Button_AM_ZoomOut.bDown != '\0')) ||
        (am_zoomdir != 0.0)) || (NAN(am_zoomdir))) {
      AM_changeWindowScale();
    }
    AM_changeWindowLoc();
  }
  return;
}

Assistant:

void AM_Ticker ()
{
	if (!automapactive)
		return;

	amclock++;

	if (am_followplayer)
	{
		AM_doFollowPlayer();
	}
	else
	{
		m_paninc.x = m_paninc.y = 0;
		if (Button_AM_PanLeft.bDown) m_paninc.x -= FTOM(F_PANINC);
		if (Button_AM_PanRight.bDown) m_paninc.x += FTOM(F_PANINC);
		if (Button_AM_PanUp.bDown) m_paninc.y += FTOM(F_PANINC);
		if (Button_AM_PanDown.bDown) m_paninc.y -= FTOM(F_PANINC);
	}

	// Change the zoom if necessary
	if (Button_AM_ZoomIn.bDown || Button_AM_ZoomOut.bDown || am_zoomdir != 0)
		AM_changeWindowScale();

	// Change x,y location
	//if (m_paninc.x || m_paninc.y)
		AM_changeWindowLoc();
}